

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::throwErrorIfNotReadableValue(Expression *e)

{
  Statement *pSVar1;
  bool bVar2;
  uint uVar3;
  InputEndpointRef *pIVar4;
  EndpointDeclaration *this;
  EndpointDetails *t;
  CompileMessage local_108;
  CompileMessage local_d0;
  CompileMessage local_98;
  pool_ptr<soul::AST::InputEndpointRef> local_60;
  pool_ptr<soul::AST::InputEndpointRef> input;
  CompileMessage local_48;
  Expression *local_10;
  Expression *e_local;
  
  local_10 = e;
  bVar2 = AST::isResolvedAsValue(e);
  if (bVar2) {
    return;
  }
  bVar2 = is_type<soul::AST::OutputEndpointRef,soul::AST::Expression>(local_10);
  if (bVar2) {
    pSVar1 = &local_10->super_Statement;
    Errors::cannotReadFromOutput<>();
    AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_48,false);
  }
  cast<soul::AST::InputEndpointRef,soul::AST::Expression>((soul *)&local_60,local_10);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_60);
  if (bVar2) {
    pIVar4 = pool_ptr<soul::AST::InputEndpointRef>::operator->(&local_60);
    uVar3 = (*(pIVar4->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])();
    if ((uVar3 & 1) != 0) {
      pIVar4 = pool_ptr<soul::AST::InputEndpointRef>::operator->(&local_60);
      this = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pIVar4->input);
      t = AST::EndpointDeclaration::getDetails(this);
      bVar2 = isEvent<soul::AST::EndpointDetails>(t);
      if (bVar2) {
        pSVar1 = &local_10->super_Statement;
        Errors::cannotReadFromEventInput<>();
        AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_98,false);
      }
    }
  }
  pool_ptr<soul::AST::InputEndpointRef>::~pool_ptr(&local_60);
  bVar2 = is_type<soul::AST::ProcessorRef,soul::AST::Expression>(local_10);
  if ((!bVar2) &&
     (bVar2 = is_type<soul::AST::ProcessorInstanceRef,soul::AST::Expression>(local_10), !bVar2)) {
    pSVar1 = &local_10->super_Statement;
    Errors::expectedValue<>();
    AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_108,false);
  }
  pSVar1 = &local_10->super_Statement;
  Errors::cannotUseProcessorAsValue<>();
  AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_d0,false);
}

Assistant:

static void throwErrorIfNotReadableValue (AST::Expression& e)
    {
        if (! AST::isResolvedAsValue (e))
        {
            if (is_type<AST::OutputEndpointRef> (e))
                e.context.throwError (Errors::cannotReadFromOutput());

            if (auto input = cast<AST::InputEndpointRef> (e))
                if (input->isResolved())
                    if (isEvent (input->input->getDetails()))
                        e.context.throwError (Errors::cannotReadFromEventInput());

            if (is_type<AST::ProcessorRef> (e) || is_type<AST::ProcessorInstanceRef> (e))
                e.context.throwError (Errors::cannotUseProcessorAsValue());

            e.context.throwError (Errors::expectedValue());
        }
    }